

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readwritefile.cpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
ReadBinaryFile_abi_cxx11_(path *filename,size_t maxsize)

{
  int iVar1;
  FILE *__stream;
  unsigned_long *puVar2;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  char *in_RSI;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  size_t n;
  FILE *f;
  char buffer [128];
  string retval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  bool *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  pair<bool,_const_char_*> *in_stack_fffffffffffffeb8;
  pair<bool,_const_char_*> *__p;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  pair<bool,_const_char_*> local_a8 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fsbridge::fopen(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    std::make_pair<bool,char_const(&)[1]>
              ((bool *)in_stack_fffffffffffffea0,
               (char (*) [1])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_const_char_*,_true>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffea0);
    do {
      __p = local_a8;
      ppVar3 = in_RDX;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_fffffffffffffe88);
      puVar2 = std::min<unsigned_long>
                         ((unsigned_long *)in_stack_fffffffffffffe90,
                          (unsigned_long *)in_stack_fffffffffffffe88);
      fread(__p,1,*puVar2,__stream);
      iVar1 = ferror(__stream);
      if (iVar1 != 0) {
        fclose(__stream);
        std::make_pair<bool,char_const(&)[1]>
                  ((bool *)in_stack_fffffffffffffea0,
                   (char (*) [1])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<bool,_const_char_*,_true>(ppVar3,__p);
        goto LAB_01abe9f7;
      }
      std::__cxx11::string::append<char*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                 (char *)in_stack_fffffffffffffea0,
                 (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      iVar1 = feof(__stream);
      in_stack_fffffffffffffe9f = false;
      if (iVar1 == 0) {
        ppVar3 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(in_stack_fffffffffffffe88);
        in_stack_fffffffffffffe9f = ppVar3 < in_RDX;
      }
    } while ((bool)in_stack_fffffffffffffe9f != false);
    fclose(__stream);
    std::make_pair<bool,std::__cxx11::string&>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
LAB_01abe9f7:
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<bool,std::string> ReadBinaryFile(const fs::path &filename, size_t maxsize)
{
    FILE *f = fsbridge::fopen(filename, "rb");
    if (f == nullptr)
        return std::make_pair(false,"");
    std::string retval;
    char buffer[128];
    do {
        const size_t n = fread(buffer, 1, std::min(sizeof(buffer), maxsize - retval.size()), f);
        // Check for reading errors so we don't return any data if we couldn't
        // read the entire file (or up to maxsize)
        if (ferror(f)) {
            fclose(f);
            return std::make_pair(false,"");
        }
        retval.append(buffer, buffer+n);
    } while (!feof(f) && retval.size() < maxsize);
    fclose(f);
    return std::make_pair(true,retval);
}